

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.hpp
# Opt level: O3

patch_op __thiscall duckdb_yyjson::patch_op_get(duckdb_yyjson *this,yyjson_val *op)

{
  patch_op pVar1;
  char *str;
  
  switch((ulong)this >> 8) {
  case 3:
    pVar1 = PATCH_OP_NONE;
    if (*(char *)((long)&op->tag + 2) == 'd' && (short)op->tag == 0x6461) {
      pVar1 = PATCH_OP_ADD;
    }
    return pVar1;
  case 4:
    break;
  default:
    return PATCH_OP_NONE;
  case 6:
    return (uint)(*(short *)((long)&op->tag + 4) != 0x6576 || (int)op->tag != 0x6f6d6572) * 5 +
           PATCH_OP_REMOVE;
  case 7:
    return (uint)(*(int *)((long)&op->tag + 3) != 0x6563616c || (int)op->tag != 0x6c706572) * 4 +
           PATCH_OP_REPLACE;
  }
  if ((int)op->tag == 0x65766f6d) {
    return PATCH_OP_MOVE;
  }
  if ((int)op->tag == 0x79706f63) {
    return PATCH_OP_COPY;
  }
  return ((int)op->tag != 0x74736574) + PATCH_OP_TEST;
}

Assistant:

yyjson_api_inline size_t unsafe_yyjson_get_len(void *val) {
    return (size_t)(((yyjson_val *)val)->tag >> YYJSON_TAG_BIT);
}